

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O0

QList<QTzType> *
parseTzIndicators(QDataStream *ds,QList<QTzType> *types,int tzh_ttisstdcnt,int tzh_ttisgmtcnt)

{
  long lVar1;
  Status SVar2;
  int in_ECX;
  QDataStream *in_RSI;
  QList<QTzType> *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  bool bVar3;
  int i_1;
  int i;
  QList<QTzType> *result;
  bool temp;
  QList<QTzType> *in_stack_ffffffffffffff88;
  QDataStream *in_stack_ffffffffffffff90;
  int local_48;
  int local_38;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QTzType *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QTzType>::QList((QList<QTzType> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  local_38 = 0;
  while( true ) {
    bVar3 = false;
    if (local_38 < in_ECX) {
      SVar2 = QDataStream::status(in_RSI);
      bVar3 = SVar2 == Ok;
    }
    if (!bVar3) break;
    QDataStream::operator>>(in_stack_ffffffffffffff90,(bool *)in_stack_ffffffffffffff88);
    local_38 = local_38 + 1;
  }
  local_48 = 0;
  while( true ) {
    bVar3 = false;
    if (local_48 < in_R8D) {
      SVar2 = QDataStream::status(in_RSI);
      bVar3 = SVar2 == Ok;
    }
    if (!bVar3) break;
    QDataStream::operator>>(in_stack_ffffffffffffff90,(bool *)in_stack_ffffffffffffff88);
    local_48 = local_48 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

static QList<QTzType> parseTzIndicators(QDataStream &ds, const QList<QTzType> &types, int tzh_ttisstdcnt,
                                        int tzh_ttisgmtcnt)
{
    QList<QTzType> result = types;
    bool temp;
    /*
      Scan and discard indicators.

      These indicators are only of use (by the date program) when "handling
      POSIX-style time zone environment variables".  The flags here say whether
      the *specification* of the zone gave the time in UTC, local standard time
      or local wall time; but whatever was specified has been digested for us,
      already, by the zone-info compiler (zic), so that the tz_time values read
      from the file (by parseTzTransitions) are all in UTC.
     */

    // Scan tzh_ttisstdcnt x 1-byte standard/wall indicators
    for (int i = 0; i < tzh_ttisstdcnt && ds.status() == QDataStream::Ok; ++i)
        ds >> temp;

    // Scan tzh_ttisgmtcnt x 1-byte UTC/local indicators
    for (int i = 0; i < tzh_ttisgmtcnt && ds.status() == QDataStream::Ok; ++i)
        ds >> temp;

    return result;
}